

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

bool __thiscall QPrinterInfo::isNull(QPrinterInfo *this)

{
  QPrintDevice *this_00;
  bool bVar1;
  QPrintDevice *pQVar2;
  
  this_00 = &((this->d_ptr).d)->m_printDevice;
  pQVar2 = &QGlobalStatic::operator_cast_to_QPrinterInfoPrivate_((QGlobalStatic *)this)->
            m_printDevice;
  if (this_00 == pQVar2) {
    bVar1 = true;
  }
  else {
    bVar1 = QPrintDevice::isValid(this_00);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }